

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

int Lodtalk::Float::stPrintString(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t size;
  ByteString *pBVar4;
  NativeError *this;
  ulong uVar5;
  char buffer [128];
  string local_98 [4];
  undefined8 *puVar3;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  puVar3 = (undefined8 *)CONCAT44(extraout_var_00,uVar2);
  uVar2 = uVar2 & 7;
  if ((uVar2 != 4) && ((uVar2 != 0 || ((uint)((ulong)*puVar3 >> 0x2a) != 0x22)))) {
    local_98[0]._M_dataplus._M_p = (pointer)&local_98[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"expected a small integer.","");
    this = (NativeError *)__cxa_allocate_exception(0x28);
    NativeError::NativeError(this,local_98);
    __cxa_throw(this,&NativeError::typeinfo,NativeError::~NativeError);
  }
  if (uVar2 == 4) {
    uVar5 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
    uVar5 = uVar5 >> 1 | (ulong)((uVar5 & 1) != 0) << 0x3f;
  }
  else {
    if ((uVar2 != 0) || ((uint)((ulong)*puVar3 >> 0x2a) != 0x22)) {
      __assert_fail("isFloat()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                    ,0x216,"double Lodtalk::Oop::decodeFloat() const");
    }
    uVar5 = puVar3[1];
  }
  snprintf((char *)local_98,0x7f,"%f",uVar5);
  iVar1 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  size = strlen((char *)local_98);
  pBVar4 = ByteString::fromNativeRange
                     ((VMContext *)CONCAT44(extraout_var_01,iVar1),(char *)local_98,size);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,pBVar4);
  return iVar1;
}

Assistant:

int Float::stPrintString(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto self = interpreter->getReceiver();
    if(!self.isFloat())
        nativeError("expected a small integer.");

    char buffer[128];
    snprintf(buffer, 127, "%f", self.decodeFloat());

    auto result = Oop::fromPointer(ByteString::fromNativeRange(interpreter->getContext(), buffer, strlen(buffer)));
    return interpreter->returnOop(result);
}